

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

lws * lws_wsi_server_new(lws_vhost *vh,lws *parent_wsi,uint sid)

{
  int *piVar1;
  uint *puVar2;
  lws_h2_netconn *plVar3;
  int iVar4;
  lws *wsi;
  lws *wsi_00;
  
  wsi = lws_get_network_wsi(parent_wsi);
  plVar3 = (wsi->h2).h2n;
  if (plVar3->highest_sid_opened < sid) {
    if ((((parent_wsi->h2).h2n)->our_set).s[3] < (parent_wsi->mux).child_count + 1) {
      wsi_00 = (lws *)0x0;
      _lws_log(4,"reached concurrent stream limit\n");
    }
    else {
      wsi_00 = lws_create_new_server_wsi(vh,(int)parent_wsi->tsi);
      if (wsi_00 == (lws *)0x0) {
        wsi_00 = (lws *)0x0;
        _lws_log(4,"new server wsi failed (vh %p)\n",vh);
      }
      else {
        plVar3->highest_sid_opened = sid;
        lws_wsi_mux_insert(wsi_00,parent_wsi,sid);
        *(ulong *)&wsi_00->field_0x2dc = *(ulong *)&wsi_00->field_0x2dc & 0xffffffffffffff7d | 2;
        plVar3 = (wsi->h2).h2n;
        (wsi_00->txc).tx_cr = (plVar3->peer_set).s[4];
        (wsi_00->txc).peer_tx_cr_est = (plVar3->our_set).s[4];
        lwsi_set_state(wsi_00,0x119);
        lwsi_set_role(wsi_00,(uint)*(ushort *)((long)&parent_wsi->wsistate + 2) << 0x10);
        wsi_00->protocol = vh->protocols;
        iVar4 = lws_ensure_user_space(wsi_00);
        if (iVar4 == 0) {
          lws_validity_confirmed(wsi_00);
          _lws_log(8,"%s: %p new ch %p, sid %d, usersp=%p\n","lws_wsi_server_new",parent_wsi,wsi_00,
                   (ulong)sid,wsi_00->user_space);
          lws_wsi_txc_describe(&wsi_00->txc,"lws_wsi_server_new",(wsi_00->mux).my_sid);
          lws_wsi_txc_describe(&wsi->txc,"lws_wsi_server_new",0);
        }
        else {
          (parent_wsi->mux).child_list = (wsi_00->mux).sibling_list;
          puVar2 = &(parent_wsi->mux).child_count;
          *puVar2 = *puVar2 - 1;
          piVar1 = &vh->context->count_wsi_allocated;
          *piVar1 = *piVar1 + -1;
          if (wsi_00->user_space != (void *)0x0) {
            lws_realloc(wsi_00->user_space,0,"free");
            wsi_00->user_space = (void *)0x0;
          }
          (*vh->protocols->callback)(wsi_00,LWS_CALLBACK_WSI_DESTROY,(void *)0x0,(void *)0x0,0);
          lws_vhost_unbind_wsi(wsi_00);
          lws_realloc(wsi_00,0,"lws_free");
          wsi_00 = (lws *)0x0;
        }
      }
    }
  }
  else {
    wsi_00 = (lws *)0x0;
    _lws_log(8,"%s: tried to open lower sid %d (%d)\n","lws_wsi_server_new",(ulong)sid);
    lws_h2_goaway(wsi,1,"Bad sid");
  }
  return wsi_00;
}

Assistant:

struct lws *
lws_wsi_server_new(struct lws_vhost *vh, struct lws *parent_wsi,
			    unsigned int sid)
{
	struct lws *wsi;
	struct lws *nwsi = lws_get_network_wsi(parent_wsi);
	struct lws_h2_netconn *h2n = nwsi->h2.h2n;

	/*
	 * The identifier of a newly established stream MUST be numerically
   	 * greater than all streams that the initiating endpoint has opened or
   	 * reserved.  This governs streams that are opened using a HEADERS frame
   	 * and streams that are reserved using PUSH_PROMISE.  An endpoint that
   	 * receives an unexpected stream identifier MUST respond with a
   	 * connection error (Section 5.4.1) of type PROTOCOL_ERROR.
	 */
	if (sid <= h2n->highest_sid_opened) {
		lwsl_info("%s: tried to open lower sid %d (%d)\n", __func__,
				sid, (int)h2n->highest_sid_opened);
		lws_h2_goaway(nwsi, H2_ERR_PROTOCOL_ERROR, "Bad sid");
		return NULL;
	}

	/* no more children allowed by parent */
	if (parent_wsi->mux.child_count + 1 >
	    parent_wsi->h2.h2n->our_set.s[H2SET_MAX_CONCURRENT_STREAMS]) {
		lwsl_notice("reached concurrent stream limit\n");
		return NULL;
	}
	wsi = lws_create_new_server_wsi(vh, parent_wsi->tsi);
	if (!wsi) {
		lwsl_notice("new server wsi failed (vh %p)\n", vh);
		return NULL;
	}

	h2n->highest_sid_opened = sid;

	lws_wsi_mux_insert(wsi, parent_wsi, sid);

	wsi->mux_substream = 1;
	wsi->seen_nonpseudoheader = 0;

	wsi->txc.tx_cr = nwsi->h2.h2n->peer_set.s[H2SET_INITIAL_WINDOW_SIZE];
	wsi->txc.peer_tx_cr_est =
			nwsi->h2.h2n->our_set.s[H2SET_INITIAL_WINDOW_SIZE];

	lwsi_set_state(wsi, LRS_ESTABLISHED);
	lwsi_set_role(wsi, lwsi_role(parent_wsi));

	wsi->protocol = &vh->protocols[0];
	if (lws_ensure_user_space(wsi))
		goto bail1;

#if defined(LWS_WITH_SERVER_STATUS)
	wsi->vhost->conn_stats.h2_subs++;
#endif

	/* get the ball rolling */
	lws_validity_confirmed(wsi);

	lwsl_info("%s: %p new ch %p, sid %d, usersp=%p\n", __func__,
		  parent_wsi, wsi, sid, wsi->user_space);

	lws_wsi_txc_describe(&wsi->txc, __func__, wsi->mux.my_sid);
	lws_wsi_txc_describe(&nwsi->txc, __func__, 0);

	return wsi;

bail1:
	/* undo the insert */
	parent_wsi->mux.child_list = wsi->mux.sibling_list;
	parent_wsi->mux.child_count--;

	vh->context->count_wsi_allocated--;

	if (wsi->user_space)
		lws_free_set_NULL(wsi->user_space);
	vh->protocols[0].callback(wsi, LWS_CALLBACK_WSI_DESTROY, NULL, NULL, 0);
	lws_vhost_unbind_wsi(wsi);
	lws_free(wsi);

	return NULL;
}